

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

uint __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::addData(Group *this,uint lgSize)

{
  uint uVar1;
  DataLocation *pDVar2;
  bool bVar3;
  DataLocationUsage *pDVar4;
  RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *pRVar5;
  Union *this_00;
  uint uVar6;
  uint i;
  uint uVar7;
  ulong uVar8;
  DataLocationUsage local_48;
  uint lgSize_local;
  uint local_3c;
  Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> *local_38;
  
  lgSize_local = lgSize;
  addMember(this);
  local_38 = &this->parentDataLocationUsage;
  uVar6 = 0xffffffff;
  bVar3 = false;
  uVar7 = 0;
  while( true ) {
    this_00 = this->parent;
    pDVar2 = (this_00->dataLocations).builder.ptr;
    pRVar5 = (this_00->dataLocations).builder.pos;
    uVar8 = (ulong)uVar7;
    if ((ulong)((long)pRVar5 - (long)pDVar2 >> 3) <= uVar8) break;
    pDVar4 = (this->parentDataLocationUsage).builder.ptr;
    if ((long)(this->parentDataLocationUsage).builder.pos - (long)pDVar4 >> 3 == uVar8) {
      kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::add<>
                (local_38);
      pDVar4 = (this->parentDataLocationUsage).builder.ptr;
      pDVar2 = (this->parent->dataLocations).builder.ptr;
    }
    DataLocationUsage::smallestHoleAtLeast
              (&local_48,(DataLocation *)(pDVar4 + uVar8),(int)pDVar2 + uVar7 * 8);
    if ((local_48.isUsed == true) && ((uint)local_48.holes.holes._2_4_ < uVar6)) {
      bVar3 = true;
      local_3c = uVar7;
      uVar6 = local_48.holes.holes._2_4_;
    }
    uVar7 = uVar7 + 1;
  }
  if (bVar3) {
    uVar1 = DataLocationUsage::allocateFromHole
                      ((this->parentDataLocationUsage).builder.ptr + local_3c,this,pDVar2 + local_3c
                       ,lgSize);
  }
  else {
    for (uVar6 = 0; (ulong)uVar6 < (ulong)((long)pRVar5 - (long)pDVar2 >> 3); uVar6 = uVar6 + 1) {
      DataLocationUsage::tryAllocateByExpanding
                (&local_48,(Group *)((this->parentDataLocationUsage).builder.ptr + uVar6),
                 (DataLocation *)this,(int)pDVar2 + uVar6 * 8);
      if (local_48.isUsed == true) {
        uVar1._0_1_ = local_48.holes.holes[2];
        uVar1._1_1_ = local_48.holes.holes[3];
        uVar1._2_1_ = local_48.holes.holes[4];
        uVar1._3_1_ = local_48.holes.holes[5];
        return uVar1;
      }
      this_00 = this->parent;
      pDVar2 = (this_00->dataLocations).builder.ptr;
      pRVar5 = (this_00->dataLocations).builder.pos;
    }
    uVar1 = Union::addNewDataLocation(this_00,lgSize_local);
    kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
    add<unsigned_int&>(local_38,&lgSize_local);
  }
  return uVar1;
}

Assistant:

uint addData(uint lgSize) override {
      addMember();

      uint bestSize = kj::maxValue;
      kj::Maybe<uint> bestLocation = nullptr;

      for (uint i = 0; i < parent.dataLocations.size(); i++) {
        // If we haven't seen this DataLocation yet, add a corresponding DataLocationUsage.
        if (parentDataLocationUsage.size() == i) {
          parentDataLocationUsage.add();
        }

        auto& usage = parentDataLocationUsage[i];
        KJ_IF_MAYBE(hole, usage.smallestHoleAtLeast(parent.dataLocations[i], lgSize)) {
          if (*hole < bestSize) {
            bestSize = *hole;
            bestLocation = i;
          }
        }
      }

      KJ_IF_MAYBE(best, bestLocation) {
        return parentDataLocationUsage[*best].allocateFromHole(
            *this, parent.dataLocations[*best], lgSize);
      }

      // There are no holes at all in the union big enough to fit this field.  Go back through all
      // of the locations and attempt to expand them to fit.
      for (uint i = 0; i < parent.dataLocations.size(); i++) {
        KJ_IF_MAYBE(result, parentDataLocationUsage[i].tryAllocateByExpanding(
            *this, parent.dataLocations[i], lgSize)) {
          return *result;
        }
      }

      // Couldn't find any space in the existing locations, so add a new one.
      uint result = parent.addNewDataLocation(lgSize);
      parentDataLocationUsage.add(lgSize);
      return result;
    }